

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

FieldType icu_63::GMTOffsetField::getTypeByLetter(UChar ch)

{
  undefined4 local_c;
  UChar ch_local;
  
  if (ch == L'H') {
    local_c = HOUR;
  }
  else if (ch == L'm') {
    local_c = MINUTE;
  }
  else if (ch == L's') {
    local_c = SECOND;
  }
  else {
    local_c = TEXT;
  }
  return local_c;
}

Assistant:

GMTOffsetField::FieldType
GMTOffsetField::getTypeByLetter(UChar ch) {
    if (ch == 0x0048 /* H */) {
        return HOUR;
    } else if (ch == 0x006D /* m */) {
        return MINUTE;
    } else if (ch == 0x0073 /* s */) {
        return SECOND;
    }
    return TEXT;
}